

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall kratos::Var::move_linked_to(Var *this,Var *new_var)

{
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  VarException *pVVar4;
  bool *pbVar5;
  element_type *this_00;
  element_type *peVar6;
  __shared_ptr_access<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *this_02;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  remove_reference_t<const_char_*> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  shared_ptr<kratos::VarCasted> *var;
  iterator __end1_2;
  iterator __begin1_2;
  set<std::shared_ptr<kratos::VarCasted>,_std::less<std::shared_ptr<kratos::VarCasted>_>,_std::allocator<std::shared_ptr<kratos::VarCasted>_>_>
  *__range1_2;
  __normal_iterator<std::shared_ptr<kratos::VarConcat>_*,_std::vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>_>
  local_2e8;
  __normal_iterator<std::shared_ptr<kratos::VarConcat>_*,_std::vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>_>
  local_2e0;
  vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
  local_2d8;
  enable_shared_from_this<kratos::Var> local_2c0;
  enable_shared_from_this<kratos::Var> local_2b0;
  __shared_ptr_access<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_2a0;
  shared_ptr<kratos::VarConcat> *concat;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
  *__range1_1;
  __normal_iterator<std::shared_ptr<kratos::VarSlice>_*,_std::vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>_>
  local_278;
  __normal_iterator<std::shared_ptr<kratos::VarSlice>_*,_std::vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>_>
  local_270;
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
  local_268;
  __shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_250;
  shared_ptr<kratos::VarSlice> *slice;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
  *__range1;
  Var *local_228;
  Var *local_220;
  Var **local_218;
  size_type local_210;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_208;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_1f0;
  string local_1e0;
  undefined1 local_1ba;
  allocator<const_kratos::IRNode_*> local_1b9;
  Var *local_1b8;
  Var *local_1b0;
  Var **local_1a8;
  size_type local_1a0;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_198;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_180;
  int local_16c;
  string local_168;
  Var *local_148;
  Var *new_var_local;
  Var *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_130;
  basic_string_view<char> local_128;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_unsigned_int>
  local_118;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_unsigned_int>
  *local_f0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_unsigned_int>
  *vargs;
  char (*local_e0) [86];
  char *local_d8;
  string *local_d0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_c8;
  basic_string_view<char> local_b8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_char_*,_const_char_*>
  local_a8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_char_*,_const_char_*>
  *local_80;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_char_*,_const_char_*>
  *vargs_1;
  size_t *local_70;
  char *local_68;
  string *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_unsigned_int>
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_unsigned_int>
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_unsigned_int>
  *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_char_*,_const_char_*>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_char_*,_const_char_*>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_char_*,_const_char_*>
  *local_10;
  
  local_148 = new_var;
  new_var_local = this;
  iVar2 = (*(new_var->super_IRNode)._vptr_IRNode[0x29])();
  if (this != (Var *)CONCAT44(extraout_var,iVar2)) {
    iVar2 = (*(local_148->super_IRNode)._vptr_IRNode[7])();
    iVar3 = (*(this->super_IRNode)._vptr_IRNode[7])();
    if (iVar2 != iVar3) {
      local_1ba = 1;
      pVVar4 = (VarException *)__cxa_allocate_exception(0x10);
      local_16c = (*(this->super_IRNode)._vptr_IRNode[7])();
      local_180.int_value = (*(local_148->super_IRNode)._vptr_IRNode[7])();
      local_d0 = &local_168;
      local_d8 = 
      "Try to move linked variable to a variable that doesn\'t match width. Need {0}, got {1}";
      local_e0 = (char (*) [86])&local_16c;
      vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_unsigned_int>
               *)&local_180;
      fmt::v7::make_args_checked<unsigned_int,unsigned_int,char[86],char>
                (&local_118,
                 (v7 *)
                 "Try to move linked variable to a variable that doesn\'t match width. Need {0}, got {1}"
                 ,local_e0,(remove_reference_t<unsigned_int> *)vargs,
                 (remove_reference_t<unsigned_int> *)in_R8);
      local_f0 = &local_118;
      local_128 = fmt::v7::to_string_view<char,_0>(local_d8);
      local_50 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)&this_local;
      local_58 = local_f0;
      local_48 = local_f0;
      local_38 = local_f0;
      local_40 = local_50;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_50,0x22,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_f0);
      format_str.size_ = (size_t)this_local;
      format_str.data_ = (char *)local_128.size_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_130.values_;
      fmt::v7::detail::vformat_abi_cxx11_(&local_168,(detail *)local_128.data_,format_str,args);
      local_1b0 = local_148;
      local_1a8 = &local_1b8;
      local_1a0 = 2;
      local_1b8 = this;
      std::allocator<const_kratos::IRNode_*>::allocator(&local_1b9);
      __l_00._M_len = local_1a0;
      __l_00._M_array = (iterator)local_1a8;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_198,__l_00,&local_1b9);
      VarException::VarException(pVVar4,&local_168,&local_198);
      local_1ba = 0;
      __cxa_throw(pVVar4,&VarException::typeinfo,VarException::~VarException);
    }
    pbVar5 = is_signed(local_148);
    bVar1 = *pbVar5;
    pbVar5 = is_signed(this);
    if ((bVar1 & 1U) != (*pbVar5 & 1U)) {
      __range1._6_1_ = 1;
      pVVar4 = (VarException *)__cxa_allocate_exception(0x10);
      pbVar5 = is_signed(this);
      local_1f0.custom.format =
           (_func_void_void_ptr_parse_context_ptr_basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_ptr
            *)"unsigned";
      if ((*pbVar5 & 1U) != 0) {
        local_1f0.custom.format =
             (_func_void_void_ptr_parse_context_ptr_basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_ptr
              *)"signed";
      }
      pbVar5 = is_signed(local_148);
      local_1f0.double_value = (double)"unsigned";
      if ((*pbVar5 & 1U) != 0) {
        local_1f0.double_value = (double)"signed";
      }
      local_60 = &local_1e0;
      local_68 = 
      "Try to move linked variable to a variable that doesn\'t match sign. Need {0}, got {1}";
      local_70 = &local_1f0.string.size;
      vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_char_*,_const_char_*>
                 *)&local_1f0;
      fmt::v7::make_args_checked<char_const*,char_const*,char[85],char>
                (&local_a8,
                 (v7 *)
                 "Try to move linked variable to a variable that doesn\'t match sign. Need {0}, got {1}"
                 ,(char (*) [85])local_70,(remove_reference_t<const_char_*> *)vargs_1,in_R8);
      local_80 = &local_a8;
      local_b8 = fmt::v7::to_string_view<char,_0>(local_68);
      local_28 = &local_c8;
      local_30 = local_80;
      local_20 = local_80;
      local_10 = local_80;
      local_18 = local_28;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_28,0xcc,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_80);
      format_str_00.size_ = local_c8.desc_;
      format_str_00.data_ = (char *)local_b8.size_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_c8.field_1.values_;
      fmt::v7::detail::vformat_abi_cxx11_(&local_1e0,(detail *)local_b8.data_,format_str_00,args_00)
      ;
      local_220 = local_148;
      local_218 = &local_228;
      local_210 = 2;
      local_228 = this;
      std::allocator<const_kratos::IRNode_*>::allocator
                ((allocator<const_kratos::IRNode_*> *)((long)&__range1 + 7));
      __l._M_len = local_210;
      __l._M_array = (iterator)local_218;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_208,__l,(allocator<const_kratos::IRNode_*> *)((long)&__range1 + 7));
      VarException::VarException(pVVar4,&local_1e0,&local_208);
      __range1._6_1_ = 0;
      __cxa_throw(pVVar4,&VarException::typeinfo,VarException::~VarException);
    }
    __end1 = std::
             vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
             ::begin(&this->slices_);
    slice = (shared_ptr<kratos::VarSlice> *)
            std::
            vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
            ::end(&this->slices_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::shared_ptr<kratos::VarSlice>_*,_std::vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>_>
                                       *)&slice), bVar1) {
      local_250 = (__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                  )__gnu_cxx::
                   __normal_iterator<std::shared_ptr<kratos::VarSlice>_*,_std::vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>_>
                   ::operator*(&__end1);
      this_00 = std::__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(local_250);
      VarSlice::set_parent(this_00,local_148);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<kratos::VarSlice>_*,_std::vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>_>
      ::operator++(&__end1);
    }
    local_270._M_current =
         (shared_ptr<kratos::VarSlice> *)
         std::
         vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
         ::begin(&this->slices_);
    local_278._M_current =
         (shared_ptr<kratos::VarSlice> *)
         std::
         vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
         ::end(&this->slices_);
    std::allocator<std::shared_ptr<kratos::VarSlice>_>::allocator
              ((allocator<std::shared_ptr<kratos::VarSlice>_> *)((long)&__range1_1 + 7));
    std::vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
    ::
    vector<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::VarSlice>*,std::vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>>,void>
              ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
                *)&local_268,local_270,local_278,
               (allocator<std::shared_ptr<kratos::VarSlice>_> *)((long)&__range1_1 + 7));
    std::
    vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>::
    operator=(&local_148->slices_,&local_268);
    std::
    vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>::
    ~vector(&local_268);
    std::allocator<std::shared_ptr<kratos::VarSlice>_>::~allocator
              ((allocator<std::shared_ptr<kratos::VarSlice>_> *)((long)&__range1_1 + 7));
    std::
    vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>::
    clear(&this->slices_);
    __end1_1 = std::
               vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
               ::begin(&this->concat_vars_);
    concat = (shared_ptr<kratos::VarConcat> *)
             std::
             vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
             ::end(&this->concat_vars_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<std::shared_ptr<kratos::VarConcat>_*,_std::vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>_>
                               *)&concat), bVar1) {
      local_2a0 = (__shared_ptr_access<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)__gnu_cxx::
                     __normal_iterator<std::shared_ptr<kratos::VarConcat>_*,_std::vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>_>
                     ::operator*(&__end1_1);
      peVar6 = std::__shared_ptr_access<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_2a0);
      (*(peVar6->super_Expr).super_Var.super_IRNode._vptr_IRNode[0x14])(peVar6,local_148);
      peVar6 = std::__shared_ptr_access<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_2a0);
      std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_2b0);
      std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_2c0);
      VarConcat::replace_var
                (peVar6,(shared_ptr<kratos::Var> *)&local_2b0,(shared_ptr<kratos::Var> *)&local_2c0)
      ;
      std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_2c0);
      std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_2b0);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<kratos::VarConcat>_*,_std::vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>_>
      ::operator++(&__end1_1);
    }
    local_2e0._M_current =
         (shared_ptr<kratos::VarConcat> *)
         std::
         vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
         ::begin(&this->concat_vars_);
    local_2e8._M_current =
         (shared_ptr<kratos::VarConcat> *)
         std::
         vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
         ::end(&this->concat_vars_);
    std::allocator<std::shared_ptr<kratos::VarConcat>_>::allocator
              ((allocator<std::shared_ptr<kratos::VarConcat>_> *)((long)&__range1_2 + 7));
    std::
    vector<std::shared_ptr<kratos::VarConcat>,std::allocator<std::shared_ptr<kratos::VarConcat>>>::
    vector<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::VarConcat>*,std::vector<std::shared_ptr<kratos::VarConcat>,std::allocator<std::shared_ptr<kratos::VarConcat>>>>,void>
              ((vector<std::shared_ptr<kratos::VarConcat>,std::allocator<std::shared_ptr<kratos::VarConcat>>>
                *)&local_2d8,local_2e0,local_2e8,
               (allocator<std::shared_ptr<kratos::VarConcat>_> *)((long)&__range1_2 + 7));
    std::
    vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
    ::operator=(&local_148->concat_vars_,&local_2d8);
    std::
    vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
    ::~vector(&local_2d8);
    std::allocator<std::shared_ptr<kratos::VarConcat>_>::~allocator
              ((allocator<std::shared_ptr<kratos::VarConcat>_> *)((long)&__range1_2 + 7));
    std::
    vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
    ::clear(&this->concat_vars_);
    __end1_2 = std::
               set<std::shared_ptr<kratos::VarCasted>,_std::less<std::shared_ptr<kratos::VarCasted>_>,_std::allocator<std::shared_ptr<kratos::VarCasted>_>_>
               ::begin(&this->casted_);
    var = (shared_ptr<kratos::VarCasted> *)
          std::
          set<std::shared_ptr<kratos::VarCasted>,_std::less<std::shared_ptr<kratos::VarCasted>_>,_std::allocator<std::shared_ptr<kratos::VarCasted>_>_>
          ::end(&this->casted_);
    while (bVar1 = std::operator!=(&__end1_2,(_Self *)&var), bVar1) {
      this_01 = (__shared_ptr_access<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::_Rb_tree_const_iterator<std::shared_ptr<kratos::VarCasted>_>::operator*
                          (&__end1_2);
      this_02 = std::
                __shared_ptr_access<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(this_01);
      iVar2 = (*(local_148->super_IRNode)._vptr_IRNode[0x29])();
      VarCasted::set_parent(this_02,(Var *)CONCAT44(extraout_var_00,iVar2));
      iVar2 = (*(local_148->super_IRNode)._vptr_IRNode[0x29])();
      std::
      set<std::shared_ptr<kratos::VarCasted>,std::less<std::shared_ptr<kratos::VarCasted>>,std::allocator<std::shared_ptr<kratos::VarCasted>>>
      ::emplace<std::shared_ptr<kratos::VarCasted>const&>
                ((set<std::shared_ptr<kratos::VarCasted>,std::less<std::shared_ptr<kratos::VarCasted>>,std::allocator<std::shared_ptr<kratos::VarCasted>>>
                  *)(CONCAT44(extraout_var_01,iVar2) + 0x208),
                 (shared_ptr<kratos::VarCasted> *)this_01);
      std::_Rb_tree_const_iterator<std::shared_ptr<kratos::VarCasted>_>::operator++(&__end1_2);
    }
    std::
    set<std::shared_ptr<kratos::VarCasted>,_std::less<std::shared_ptr<kratos::VarCasted>_>,_std::allocator<std::shared_ptr<kratos::VarCasted>_>_>
    ::clear(&this->casted_);
  }
  return;
}

Assistant:

void Var::move_linked_to(kratos::Var *new_var) {
    if (this == new_var->get_var_root_parent()) return;
    // this one doesn't do much checking
    // user code code should check instead
    if (new_var->width() != width()) {
        throw VarException(::format("Try to move linked variable to a variable that "
                                    "doesn't match width. Need {0}, got {1}",
                                    width(), new_var->width()),
                           {this, new_var});
    }
    if (new_var->is_signed() != is_signed()) {
        throw VarException(::format("Try to move linked variable to a variable that "
                                    "doesn't match sign. Need {0}, got {1}",
                                    is_signed() ? "signed" : "unsigned",
                                    new_var->is_signed() ? "signed" : "unsigned"),
                           {this, new_var});
    }
    // move all references held in var to the new var
    // and change the parents
    for (auto &slice : slices_) {
        slice->set_parent(new_var);
    }
    new_var->slices_ = std::vector(slices_.begin(), slices_.end());
    slices_.clear();

    // change concat'ed vars
    // we use overloaded ones
    for (auto const &concat : concat_vars_) {
        concat->move_linked_to(new_var);
        concat->replace_var(shared_from_this(), new_var->shared_from_this());
    }
    new_var->concat_vars_ =
        std::vector<std::shared_ptr<VarConcat>>(concat_vars_.begin(), concat_vars_.end());
    concat_vars_.clear();

    // casted
    for (auto const &var : casted_) {
        var->set_parent(new_var->get_var_root_parent());
        new_var->get_var_root_parent()->casted_.emplace(var);
    }
    casted_.clear();
}